

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * strscat(char *dest,char *src,size_t size)

{
  size_t sVar1;
  size_t l;
  size_t size_local;
  char *src_local;
  char *dest_local;
  
  if ((((dest != (char *)0x0) && (src != (char *)0x0)) && (size != 0)) &&
     ((*src != '\0' && (sVar1 = strlen(dest), sVar1 < size)))) {
    strscpy(dest + sVar1,src,size - sVar1);
  }
  return dest;
}

Assistant:

char *
strscat(char *dest, const char *src, size_t size) {
  size_t l;

  if (dest == NULL || src == NULL || size == 0 || *src == 0) {
    return dest;
  }

  l = strlen(dest);
  if (l < size) {
    strscpy(dest + l, src, size - l);
  }
  return dest;
}